

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::BilinearIntersection>
pbrt::IntersectBilinearPatch
          (Ray *ray,Float tMax,Point3f *p00,Point3f *p10,Point3f *p01,Point3f *p11)

{
  Point3<float> *w;
  bool bVar1;
  bool bVar2;
  Ray *pRVar3;
  Point3f *p;
  bool bVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  Point3<float> *in_R9;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar33 [60];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float in_XMM6_Da;
  float fVar41;
  float fVar42;
  Vector3<float> VVar43;
  optional<pbrt::BilinearIntersection> oVar44;
  Float u2;
  Float u1;
  float local_140;
  float local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Tuple3<pbrt::Vector3,_float> local_108;
  undefined1 local_f8 [16];
  Ray *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Point3f *local_b0;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 auVar27 [56];
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = tMax;
  auVar27 = in_register_00001204._4_56_;
  local_128 = auVar9._0_16_;
  local_e0 = ray;
  local_b0 = p00;
  VVar43 = Point3<float>::operator-(p01,p10);
  local_78.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar27;
  local_78._0_8_ = vmovlps_avx(auVar10._0_16_);
  VVar43 = Point3<float>::operator-(p11,in_R9);
  local_88.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar27;
  local_88._0_8_ = vmovlps_avx(auVar11._0_16_);
  VVar43 = Cross<float>((Vector3<float> *)&local_78,(Vector3<float> *)&local_88);
  p = local_b0;
  local_118._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar27;
  local_f8 = auVar12._0_16_;
  VVar43 = Point3<float>::operator-(in_R9,p01);
  local_78.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar27;
  local_d8 = auVar13._0_16_;
  local_78._0_8_ = vmovlps_avx(local_d8);
  local_138._0_4_ = local_78.z;
  VVar43 = Point3<float>::operator-(p11,p10);
  local_88.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar27;
  local_48 = auVar14._0_16_;
  local_88._0_8_ = vmovlps_avx(local_48);
  local_c8._0_4_ = local_88.z;
  VVar43 = Point3<float>::operator-(p10,p);
  local_98.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar27;
  local_98._0_8_ = vmovlps_avx(auVar15._0_16_);
  VVar43 = Point3<float>::operator-(p01,p);
  local_a8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar27;
  w = p + 1;
  local_a8._0_8_ = vmovlps_avx(auVar16._0_16_);
  auVar33 = ZEXT1260(local_f8._4_12_);
  auVar35 = vmovshdup_avx(local_f8);
  auVar27 = (undefined1  [56])0x0;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * p[1].super_Tuple3<pbrt::Point3,_float>.y)
                                   ),local_f8,
                            ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.x));
  auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)local_118._0_4_),
                            ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.z));
  local_118._0_4_ = auVar35._0_4_;
  VVar43 = Cross<float>((Vector3<float> *)&local_98,(Vector3<float> *)w);
  auVar28._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._4_60_ = auVar33;
  auVar17._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar27;
  auVar35._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.x * local_48._0_4_;
  auVar35._4_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.y * local_48._4_4_;
  auVar35._8_4_ = auVar27._0_4_ * local_48._8_4_;
  auVar35._12_4_ = auVar27._4_4_ * local_48._12_4_;
  auVar35 = vmovshdup_avx(auVar35);
  auVar35 = vfmadd231ss_fma(auVar35,auVar17._0_16_,local_48);
  local_f8 = vfmadd231ss_fma(auVar35,auVar28._0_16_,ZEXT416((uint)local_c8._0_4_));
  VVar43 = Cross<float>((Vector3<float> *)&local_a8,(Vector3<float> *)w);
  auVar29._4_60_ = auVar28._4_60_;
  auVar29._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar27;
  auVar8._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.x * local_d8._0_4_;
  auVar8._4_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.y * local_d8._4_4_;
  auVar8._8_4_ = auVar27._0_4_ * local_d8._8_4_;
  auVar8._12_4_ = auVar27._4_4_ * local_d8._12_4_;
  auVar35 = vmovshdup_avx(auVar8);
  auVar35 = vfmadd231ss_fma(auVar35,auVar18._0_16_,local_d8);
  auVar35 = vfmadd231ss_fma(auVar35,auVar29._0_16_,ZEXT416((uint)local_138._0_4_));
  bVar4 = Quadratic((float)local_118._0_4_,
                    auVar35._0_4_ - ((float)local_118._0_4_ + (float)local_f8._0_4_),
                    (float)local_f8._0_4_,&local_13c,&local_140);
  pRVar3 = local_e0;
  uVar5 = extraout_RDX;
  if (bVar4) {
    auVar33 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
    auVar6 = local_128;
    if ((0.0 <= local_13c) && (local_13c <= 1.0)) {
      auVar27 = ZEXT856(0);
      VVar43 = Lerp<pbrt::Vector3,float>(local_13c,&local_98,&local_a8);
      local_58.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar27;
      local_58._0_8_ = vmovlps_avx(auVar19._0_16_);
      auVar27 = (undefined1  [56])0x0;
      VVar43 = Lerp<pbrt::Vector3,float>(local_13c,&local_88,&local_78);
      local_108.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar27;
      local_108._0_8_ = vmovlps_avx(auVar20._0_16_);
      VVar43 = Cross<float>((Vector3<float> *)w,(Vector3<float> *)&local_108);
      auVar30._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._4_60_ = auVar33;
      auVar21._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar27;
      auVar8 = auVar21._0_16_;
      auVar36._0_4_ =
           VVar43.super_Tuple3<pbrt::Vector3,_float>.x * VVar43.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar36._4_4_ =
           VVar43.super_Tuple3<pbrt::Vector3,_float>.y * VVar43.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar36._8_4_ = auVar27._0_4_ * auVar27._0_4_;
      auVar36._12_4_ = auVar27._4_4_ * auVar27._4_4_;
      local_68._0_8_ = vmovlps_avx(auVar8);
      auVar35 = vmovshdup_avx(auVar36);
      auVar35 = vfmadd231ss_fma(auVar35,auVar8,auVar8);
      local_138 = vfmadd231ss_fma(auVar35,auVar30._0_16_,auVar30._0_16_);
      local_68.z = auVar30._0_4_;
      VVar43 = Cross<float>((Vector3<float> *)&local_68,(Vector3<float> *)&local_58);
      auVar31._4_60_ = auVar30._4_60_;
      auVar31._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar27;
      auVar6 = auVar22._0_16_;
      auVar35 = vmovshdup_avx(auVar6);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * local_108.y)),auVar6,
                               ZEXT416((uint)local_108.x));
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ *
                                              p[1].super_Tuple3<pbrt::Point3,_float>.y)),auVar6,
                                ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.x));
      auVar8 = vfmadd231ss_fma(auVar8,auVar31._0_16_,ZEXT416((uint)local_108.z));
      auVar35 = vfmadd231ss_fma(auVar35,auVar31._0_16_,
                                ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.z));
      in_XMM6_Da = auVar35._0_4_ / local_138._0_4_;
      uVar5 = vcmpss_avx512f(auVar35,local_138,6);
      bVar4 = (bool)((byte)uVar5 & 1);
      uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x20,auVar35,6);
      bVar1 = (bool)((byte)uVar5 & 1);
      iVar37 = local_128._0_4_;
      uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x20,auVar8,5);
      bVar2 = (bool)((byte)uVar5 & 1);
      auVar6._0_4_ = (uint)bVar4 * iVar37 +
                     (uint)!bVar4 *
                     ((uint)bVar2 * iVar37 +
                     (uint)!bVar2 *
                     ((uint)bVar1 * iVar37 + (uint)!bVar1 * (int)(auVar8._0_4_ / local_138._0_4_)));
      auVar6._4_12_ = auVar8._4_12_;
      uVar5 = extraout_RDX_00;
    }
    fVar41 = auVar6._0_4_;
    fVar38 = local_128._0_4_;
    auVar27 = (undefined1  [56])0x0;
    fVar40 = local_13c;
    if ((0.0 <= local_140) &&
       (auVar33 = (undefined1  [60])0x0, fVar40 = local_13c, local_140 <= 1.0)) {
      if ((local_140 != local_13c) || (fVar40 = local_13c, NAN(local_140) || NAN(local_13c))) {
        local_d8._0_4_ = in_XMM6_Da;
        local_138._0_4_ = local_13c;
        local_118 = auVar6;
        VVar43 = Lerp<pbrt::Vector3,float>(local_140,&local_98,&local_a8);
        local_58.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar23._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar23._8_56_ = auVar27;
        local_58._0_8_ = vmovlps_avx(auVar23._0_16_);
        auVar27 = (undefined1  [56])0x0;
        VVar43 = Lerp<pbrt::Vector3,float>(local_140,&local_88,&local_78);
        local_108.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar24._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar24._8_56_ = auVar27;
        local_108._0_8_ = vmovlps_avx(auVar24._0_16_);
        VVar43 = Cross<float>((Vector3<float> *)w,(Vector3<float> *)&local_108);
        local_68.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar25._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar25._8_56_ = auVar27;
        local_c8 = auVar25._0_16_;
        local_f8._0_4_ = local_68.z;
        local_68._0_8_ = vmovlps_avx(local_c8);
        VVar43 = Cross<float>((Vector3<float> *)&local_68,(Vector3<float> *)&local_58);
        auVar32._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar32._4_60_ = auVar33;
        auVar26._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar26._8_56_ = auVar27;
        auVar6 = auVar26._0_16_;
        auVar35 = vmovshdup_avx(auVar6);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ *
                                               p[1].super_Tuple3<pbrt::Point3,_float>.y)),auVar6,
                                 ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.x));
        auVar8 = vfmadd231ss_fma(auVar8,auVar32._0_16_,
                                 ZEXT416((uint)p[1].super_Tuple3<pbrt::Point3,_float>.z));
        fVar34 = auVar8._0_4_;
        fVar38 = local_128._0_4_;
        fVar41 = local_118._0_4_;
        uVar5 = extraout_RDX_01;
        fVar40 = (float)local_138._0_4_;
        in_XMM6_Da = (float)local_d8._0_4_;
        if (0.0 <= fVar34) {
          auVar39._0_4_ = local_c8._0_4_ * local_c8._0_4_;
          auVar39._4_4_ = local_c8._4_4_ * local_c8._4_4_;
          auVar39._8_4_ = local_c8._8_4_ * local_c8._8_4_;
          auVar39._12_4_ = local_c8._12_4_ * local_c8._12_4_;
          auVar8 = vmovshdup_avx(auVar39);
          auVar8 = vfmadd231ss_fma(auVar8,local_c8,local_c8);
          auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_f8._0_4_),ZEXT416((uint)local_f8._0_4_),
                                   auVar8);
          fVar42 = auVar8._0_4_;
          if (fVar34 <= fVar42) {
            auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * local_108.y)),auVar6,
                                      ZEXT416((uint)local_108.x));
            auVar35 = vfmadd231ss_fma(auVar35,auVar32._0_16_,ZEXT416((uint)local_108.z));
            fVar7 = auVar35._0_4_ / fVar42;
            if ((fVar7 < fVar41) && (0.0 < fVar7)) {
              fVar40 = local_140;
              in_XMM6_Da = fVar34 / fVar42;
              fVar41 = fVar7;
            }
          }
        }
      }
    }
    if (fVar41 < fVar38) {
      *(undefined1 *)&(pRVar3->d).super_Tuple3<pbrt::Vector3,_float>.x = 1;
      (pRVar3->o).super_Tuple3<pbrt::Point3,_float>.x = fVar40;
      (pRVar3->o).super_Tuple3<pbrt::Point3,_float>.y = in_XMM6_Da;
      (pRVar3->o).super_Tuple3<pbrt::Point3,_float>.z = fVar41;
      goto LAB_0040e5c8;
    }
  }
  (pRVar3->o).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (pRVar3->o).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(pRVar3->o).super_Tuple3<pbrt::Point3,_float>.z = 0;
LAB_0040e5c8:
  oVar44._8_8_ = uVar5;
  oVar44.optionalValue._0_8_ = pRVar3;
  return oVar44;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<BilinearIntersection> IntersectBilinearPatch(
    const Ray &ray, Float tMax, const Point3f &p00, const Point3f &p10,
    const Point3f &p01, const Point3f &p11) {
    // Find quadratic coefficients for distance from ray to $u$ line
    Vector3f qn = Cross(p10 - p00, p01 - p11);
    Vector3f e11 = p11 - p10, e00 = p01 - p00;
    Vector3f q00 = p00 - ray.o, q10 = p10 - ray.o;
    Float a = Dot(qn, ray.d);
    Float c = Dot(Cross(q00, ray.d), e00);
    Float b = Dot(Cross(q10, ray.d), e11) - (a + c);

    // Solve quadratic for bilinear patch intersection
    Float u1, u2;
    if (!Quadratic(a, b, c, &u1, &u2))
        return {};

    Float t = tMax, u, v;
    // Compute $(u,v)$ and ray $t$ corresponding to first quadratic root
    if (0 <= u1 && u1 <= 1) {
        Vector3f pa = Lerp(u1, q00, q10), pb = Lerp(u1, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t1 = Dot(n, pb), v1 = Dot(n, ray.d);
        // Set _u_, _v_, and _t_ if intersection is valid
        if (t1 > 0 && 0 <= v1 && v1 <= det) {
            u = u1;
            v = v1 / det;
            t = t1 / det;
        }
    }

    // Compute $(u,v)$ and ray $t$ corresponding to second quadratic root
    if (0 <= u2 && u2 <= 1 && u2 != u1) {
        Vector3f pa = Lerp(u2, q00, q10), pb = Lerp(u2, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t2 = Dot(n, pb) / det;
        Float v2 = Dot(n, ray.d);
        if (0 <= v2 && v2 <= det && t > t2 && t2 > 0) {
            t = t2;
            u = u2;
            v = v2 / det;
        }
    }

    // TODO: reject hits with sufficiently small t that we're not sure.
    // Check intersection $t$ against _tMax_ and possibly return intersection
    if (t >= tMax)
        return {};
    return BilinearIntersection{{u, v}, t};
}